

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_synthesis.c
# Opt level: O1

int av1_add_film_grain(aom_film_grain_t *params,aom_image_t *src,aom_image_t *dst)

{
  int *cr_grain;
  aom_img_fmt_t aVar1;
  aom_matrix_coefficients_t aVar2;
  uint uVar3;
  short sVar4;
  ushort uVar5;
  sbyte sVar6;
  sbyte sVar7;
  bool bVar8;
  aom_transfer_characteristics_t aVar9;
  aom_chroma_sample_position_t aVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint right_stride;
  int iVar14;
  int **ppiVar15;
  int *piVar16;
  int **ppiVar17;
  int *piVar18;
  int *piVar19;
  int *left_block;
  int *left_block_00;
  int *left_block_01;
  int *__s;
  int *__s_00;
  int *__s_01;
  long lVar20;
  undefined8 *puVar21;
  byte bVar22;
  byte bVar24;
  byte bVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  bool bVar30;
  int iVar31;
  size_t sVar32;
  uint uVar33;
  uint uVar34;
  int iVar35;
  uint uVar36;
  int iVar37;
  int iVar38;
  uint uVar39;
  undefined4 uVar40;
  long lVar41;
  int **ppiVar42;
  long lVar43;
  uint height;
  uint uVar44;
  uint uVar45;
  ulong uVar46;
  long lVar47;
  ulong uVar48;
  ulong uVar49;
  int *cr_grain_00;
  int iVar50;
  uint16_t *dst16;
  int *piVar51;
  int iVar52;
  ulong uVar53;
  int j;
  int iVar54;
  long lVar55;
  uint16_t uVar56;
  int iVar57;
  uchar *puVar58;
  ulong uVar59;
  long lVar60;
  int *piVar61;
  void *pvVar62;
  int *piVar63;
  uint uVar64;
  uint uVar65;
  uchar *puVar66;
  int iVar67;
  int iVar68;
  size_t sVar69;
  ulong __n;
  ulong uVar70;
  int iVar71;
  int iVar72;
  bool bVar73;
  bool bVar74;
  undefined1 auVar75 [16];
  int local_338;
  int local_330;
  int *local_208;
  int *local_180;
  int *cb_col_buf;
  int *y_col_buf;
  int *cr_line_buf;
  int *cb_line_buf;
  int *y_line_buf;
  int *cr_grain_block;
  int *cb_grain_block;
  int *luma_grain_block;
  int **pred_pos_chroma;
  int **pred_pos_luma;
  uchar *local_128;
  uchar *local_120;
  uchar *local_118;
  uchar *local_110;
  uchar *local_108;
  uchar *local_100;
  uchar *local_f8;
  uchar *local_f0;
  uchar *local_e8;
  uchar *local_e0;
  uchar *local_d8;
  uchar *local_d0;
  uchar *local_c8;
  uchar *local_c0;
  uchar *local_b8;
  ulong local_b0;
  uchar *local_a8;
  uchar *local_a0;
  uchar *local_98;
  uchar *local_90;
  uchar *local_88;
  uchar *local_80;
  ulong local_78;
  int *local_70;
  ulong local_68;
  ulong local_60;
  long local_58;
  ulong local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  byte bVar23;
  
  aVar1 = src->fmt;
  aVar2 = src->mc;
  if ((int)aVar1 < 0x902) {
    bVar8 = true;
    switch(aVar1) {
    case AOM_IMG_FMT_I420:
    case AOM_IMG_FMT_AOMI420:
      sVar6 = 0;
      sVar7 = 0;
      goto LAB_00187dd6;
    default:
switchD_00187d75_caseD_103:
      av1_add_film_grain_cold_2();
      return -1;
    case AOM_IMG_FMT_I422:
      local_338 = 1;
      sVar6 = 0;
      sVar7 = 0;
      break;
    case AOM_IMG_FMT_I444:
      sVar6 = 0;
      sVar7 = 0;
LAB_00187e4e:
      local_338 = 0;
    }
LAB_00187e57:
    local_330 = 0;
  }
  else {
    if (aVar1 == AOM_IMG_FMT_I44416) {
      bVar8 = false;
      sVar7 = 1;
      sVar6 = 1;
      goto LAB_00187e4e;
    }
    if (aVar1 == AOM_IMG_FMT_I42216) {
      bVar8 = false;
      sVar7 = 1;
      sVar6 = 1;
      local_338 = 1;
      goto LAB_00187e57;
    }
    if (aVar1 != AOM_IMG_FMT_I42016) goto switchD_00187d75_caseD_103;
    sVar7 = 1;
    sVar6 = 1;
    bVar8 = false;
LAB_00187dd6:
    local_338 = 1;
    local_330 = 1;
  }
  dst->fmt = aVar1;
  dst->r_h = src->r_h;
  uVar3 = src->d_w;
  uVar34 = src->d_h;
  uVar33 = src->r_w;
  dst->bit_depth = src->bit_depth;
  dst->d_w = uVar3;
  dst->d_h = uVar34;
  dst->r_w = uVar33;
  aVar9 = src->tc;
  dst->cp = src->cp;
  dst->tc = aVar9;
  dst->mc = aVar2;
  aVar10 = src->csp;
  dst->monochrome = src->monochrome;
  dst->csp = aVar10;
  dst->range = src->range;
  uVar3 = src->y_chroma_shift;
  dst->x_chroma_shift = src->x_chroma_shift;
  dst->y_chroma_shift = uVar3;
  iVar38 = src->spatial_id;
  dst->temporal_id = src->temporal_id;
  dst->spatial_id = iVar38;
  uVar3 = src->d_w;
  uVar34 = src->d_h;
  if (uVar34 != 0) {
    iVar38 = dst->stride[0];
    puVar58 = dst->planes[0];
    iVar68 = src->stride[0];
    puVar66 = src->planes[0];
    uVar33 = uVar34;
    do {
      memcpy(puVar58,puVar66,(long)(int)uVar3 << sVar6);
      puVar66 = puVar66 + iVar68;
      puVar58 = puVar58 + iVar38;
      uVar33 = uVar33 - 1;
    } while (uVar33 != 0);
  }
  uVar33 = src->d_w;
  lVar27 = (long)(int)uVar33;
  uVar39 = src->d_h;
  uVar46 = (ulong)uVar39;
  if (((uVar39 | uVar33) & 1) != 0) {
    puVar58 = dst->planes[0];
    iVar38 = dst->stride[0];
    if (bVar8) {
      if (0 < (int)uVar39 && (uVar33 & 1) != 0) {
        puVar66 = puVar58 + lVar27;
        do {
          *puVar66 = puVar66[-1];
          puVar66 = puVar66 + iVar38;
          uVar46 = uVar46 - 1;
        } while (uVar46 != 0);
      }
      if ((uVar39 & 1) != 0) {
        lVar47 = (long)(int)(uVar39 * iVar38);
        lVar41 = (long)(int)((uVar39 - 1) * iVar38);
        sVar32 = (size_t)(int)(uVar33 + 1 & 0xfffffffe);
LAB_00187ffe:
        memcpy(puVar58 + lVar47,puVar58 + lVar41,sVar32);
      }
    }
    else {
      iVar38 = iVar38 / 2;
      if (0 < (int)uVar39 && (uVar33 & 1) != 0) {
        puVar66 = puVar58 + lVar27 * 2;
        do {
          *(undefined2 *)puVar66 = *(undefined2 *)(puVar66 + -2);
          puVar66 = puVar66 + (long)iVar38 * 2;
          uVar46 = uVar46 - 1;
        } while (uVar46 != 0);
      }
      if ((uVar39 & 1) != 0) {
        lVar47 = (long)(int)(uVar39 * iVar38) * 2;
        lVar41 = (long)(int)((uVar39 - 1) * iVar38) * 2;
        sVar32 = (lVar27 + 1U & 0x7ffffffffffffffe) * 2;
        goto LAB_00187ffe;
      }
    }
  }
  iVar38 = (uVar3 & 1) + uVar3;
  uVar34 = (uVar34 & 1) + uVar34;
  bVar22 = (byte)local_330;
  bVar23 = (byte)local_338;
  if (src->monochrome == 0) {
    iVar68 = (int)uVar34 >> bVar22;
    if (iVar68 != 0) {
      iVar11 = dst->stride[1];
      puVar58 = dst->planes[1];
      iVar12 = src->stride[1];
      puVar66 = src->planes[1];
      iVar13 = iVar68;
      do {
        memcpy(puVar58,puVar66,(long)(iVar38 >> bVar23) << sVar6);
        puVar66 = puVar66 + iVar12;
        puVar58 = puVar58 + iVar11;
        iVar13 = iVar13 + -1;
      } while (iVar13 != 0);
      if (iVar68 != 0) {
        iVar11 = dst->stride[2];
        puVar58 = dst->planes[2];
        iVar12 = src->stride[2];
        puVar66 = src->planes[2];
        do {
          memcpy(puVar58,puVar66,(long)(iVar38 >> bVar23) << sVar6);
          puVar66 = puVar66 + iVar12;
          puVar58 = puVar58 + iVar11;
          iVar68 = iVar68 + -1;
        } while (iVar68 != 0);
      }
    }
  }
  puVar58 = dst->planes[0];
  iVar11 = dst->stride[0] >> sVar7;
  local_118 = dst->planes[1];
  local_120 = dst->planes[2];
  iVar12 = dst->stride[1] >> sVar7;
  random_register = params->random_seed;
  uVar33 = 0x20 >> bVar23;
  height = 2 >> bVar22;
  uVar46 = (ulong)height;
  uVar39 = 2 >> bVar23;
  iVar68 = params->overlap_flag;
  uVar3 = params->bit_depth;
  iVar13 = 0x80 << ((char)uVar3 - 8U & 0x1f);
  grain_min = -iVar13;
  grain_max = iVar13 + -1;
  pred_pos_luma = (int **)0x0;
  pred_pos_chroma = (int **)0x0;
  luma_grain_block = (int *)0x0;
  cb_grain_block = (int *)0x0;
  cr_grain_block = (int *)0x0;
  y_line_buf = (int *)0x0;
  cb_line_buf = (int *)0x0;
  cr_line_buf = (int *)0x0;
  y_col_buf = (int *)0x0;
  cb_col_buf = (int *)0x0;
  local_180 = (int *)0x0;
  chroma_subblock_size_y = 0x20U >> bVar22;
  chroma_subblock_size_x = uVar33;
  memset(scaling_lut_y,0,0x400);
  memset(scaling_lut_cb,0,0x400);
  memset(scaling_lut_cr,0,0x400);
  sVar69 = ((long)params->ar_coeff_lag + 1) * (long)params->ar_coeff_lag * 2;
  bVar74 = 0 < params->num_y_points;
  ppiVar15 = (int **)aom_calloc(sVar69,8);
  if (ppiVar15 == (int **)0x0) {
    return -1;
  }
  iVar13 = (int)sVar69;
  local_128 = puVar58;
  if (0 < iVar13) {
    uVar59 = 0;
    do {
      piVar16 = (int *)aom_malloc(0xc);
      ppiVar15[uVar59] = piVar16;
      if (piVar16 == (int *)0x0) {
        iVar13 = -1;
        goto LAB_00188610;
      }
      uVar59 = uVar59 + 1;
    } while ((sVar69 & 0xffffffff) != uVar59);
  }
  iVar35 = iVar13 + (uint)bVar74;
  ppiVar42 = (int **)0x8;
  ppiVar17 = (int **)aom_calloc((long)iVar35,8);
  if (ppiVar17 != (int **)0x0) {
    if (0 < iVar35) {
      uVar59 = 0;
      do {
        piVar16 = (int *)aom_malloc(0xc);
        ppiVar17[uVar59] = piVar16;
        if (piVar16 == (int *)0x0) goto LAB_0018860a;
        uVar59 = uVar59 + 1;
      } while (iVar13 + (uint)bVar74 != uVar59);
    }
    iVar35 = uVar39 * 3 + 3;
    iVar67 = uVar39 * 3 + uVar33 * 2;
    if (params->ar_coeff_lag < 1) {
      iVar13 = 0;
    }
    else {
      iVar31 = -params->ar_coeff_lag;
      ppiVar42 = (int **)0x0;
      lVar27 = 0;
      do {
        if (-1 < params->ar_coeff_lag) {
          lVar27 = (long)(int)lVar27;
          iVar13 = -params->ar_coeff_lag;
          do {
            piVar16 = ppiVar15[lVar27];
            *piVar16 = iVar31;
            piVar16[1] = iVar13;
            piVar16[2] = 0;
            piVar16 = ppiVar17[lVar27];
            *piVar16 = iVar31;
            piVar16[1] = iVar13;
            piVar16[2] = 0;
            lVar27 = lVar27 + 1;
            bVar74 = iVar13 < params->ar_coeff_lag;
            iVar13 = iVar13 + 1;
          } while (bVar74);
        }
        iVar13 = (int)lVar27;
        iVar31 = iVar31 + 1;
      } while (iVar31 != 0);
    }
    iVar31 = params->ar_coeff_lag;
    if (0 < iVar31) {
      ppiVar42 = ppiVar17 + iVar13;
      lVar27 = 0;
      do {
        iVar52 = (int)lVar27 - iVar31;
        piVar16 = ppiVar15[iVar13 + lVar27];
        *piVar16 = 0;
        piVar16[1] = iVar52;
        piVar16[2] = 0;
        piVar16 = ppiVar42[lVar27];
        *piVar16 = 0;
        piVar16[1] = iVar52;
        piVar16[2] = 0;
        lVar27 = lVar27 + 1;
      } while ((int)lVar27 != iVar31);
      iVar13 = iVar13 + (int)lVar27;
    }
    uVar40 = SUB84(ppiVar42,0);
    uVar64 = height * 3 + (0x20U >> bVar22) * 2 + 3;
    right_stride = iVar35 + iVar67 + 3;
    uVar59 = (ulong)right_stride;
    if (0 < params->num_y_points) {
      piVar16 = ppiVar17[iVar13];
      piVar16[0] = 0;
      piVar16[1] = 0;
      piVar16[2] = 1;
    }
    lVar27 = (long)iVar11;
    pred_pos_chroma = ppiVar17;
    pred_pos_luma = ppiVar15;
    piVar16 = (int *)aom_malloc(lVar27 * 8);
    lVar47 = (long)iVar12;
    sVar69 = uVar46 * lVar47 * 4;
    y_line_buf = piVar16;
    piVar18 = (int *)aom_malloc(sVar69);
    cb_line_buf = piVar18;
    piVar19 = (int *)aom_malloc(sVar69);
    cr_line_buf = piVar19;
    left_block = (int *)aom_malloc(0x110);
    __n = (ulong)(uVar39 * 4);
    y_col_buf = left_block;
    left_block_00 = (int *)aom_malloc((chroma_subblock_size_y + height) * __n);
    cb_col_buf = left_block_00;
    left_block_01 = (int *)aom_malloc((chroma_subblock_size_y + height) * __n);
    local_180 = left_block_01;
    __s = (int *)aom_malloc(0x5d88);
    uVar49 = (ulong)(uVar64 * right_stride * 4);
    luma_grain_block = __s;
    __s_00 = (int *)aom_malloc(uVar49);
    cb_grain_block = __s_00;
    __s_01 = (int *)aom_malloc(uVar49);
    auVar75._0_4_ = -(uint)((int)((ulong)piVar16 >> 0x20) == 0 && (int)piVar16 == 0);
    auVar75._4_4_ = -(uint)((int)piVar18 == 0 && (int)((ulong)piVar18 >> 0x20) == 0);
    auVar75._8_4_ = -(uint)((int)((ulong)piVar19 >> 0x20) == 0 && (int)piVar19 == 0);
    auVar75._12_4_ = -(uint)((int)left_block == 0 && (int)((ulong)left_block >> 0x20) == 0);
    iVar13 = movmskps(uVar40,auVar75);
    cr_grain_block = __s_01;
    if (((left_block_01 != (int *)0x0 && left_block_00 != (int *)0x0) && __s != (int *)0x0) &&
        iVar13 == 0) {
      iVar13 = -1;
      if (__s_01 != (int *)0x0 && __s_00 != (int *)0x0) {
        if (params->num_y_points == 0) {
          memset(__s,0,0x5d88);
        }
        else {
          bVar24 = ((char)params->grain_scale_shift - (char)params->bit_depth) + 0xc;
          iVar13 = params->ar_coeff_lag;
          iVar31 = params->ar_coeff_shift;
          uVar44 = (uint)random_register;
          lVar41 = 0;
          piVar51 = __s;
          do {
            lVar55 = 0;
            do {
              uVar44 = uVar44 & 0xffff;
              uVar44 = (uVar44 ^ uVar44 >> 1 ^ uVar44 >> 0xc ^ uVar44 >> 3) << 0xf | uVar44 >> 1;
              piVar51[lVar55] =
                   *(int *)((long)gaussian_sequence + (ulong)(uVar44 >> 3 & 0x1ffc)) +
                   ((1 << (bVar24 & 0x1f)) >> 1) >> (bVar24 & 0x1f);
              iVar50 = grain_max;
              iVar52 = grain_min;
              lVar55 = lVar55 + 1;
            } while (lVar55 != 0x52);
            lVar41 = lVar41 + 1;
            piVar51 = piVar51 + 0x52;
          } while (lVar41 != 0x49);
          uVar36 = (iVar13 + 1) * iVar13 * 2;
          random_register = (uint16_t)uVar44;
          lVar41 = 3;
          do {
            lVar55 = 3;
            do {
              if ((int)uVar36 < 1) {
                iVar13 = 0;
              }
              else {
                uVar28 = 0;
                iVar13 = 0;
                do {
                  iVar13 = iVar13 + __s[ppiVar15[uVar28][1] + (int)lVar55 +
                                        (*ppiVar15[uVar28] + (int)lVar41) * 0x52] *
                                    params->ar_coeffs_y[uVar28];
                  uVar28 = uVar28 + 1;
                } while (uVar36 != uVar28);
              }
              iVar54 = (iVar13 + (1 << ((char)iVar31 - 1U & 0x1f)) >>
                       ((byte)params->ar_coeff_shift & 0x1f)) + __s[lVar41 * 0x52 + lVar55];
              iVar13 = iVar50;
              if (iVar54 < iVar50) {
                iVar13 = iVar54;
              }
              if (iVar54 < iVar52) {
                iVar13 = iVar52;
              }
              __s[lVar41 * 0x52 + lVar55] = iVar13;
              lVar55 = lVar55 + 1;
            } while (lVar55 != 0x4f);
            lVar41 = lVar41 + 1;
          } while (lVar41 != 0x49);
        }
        bVar24 = ((char)params->grain_scale_shift - (char)params->bit_depth) + 0xc;
        iVar13 = params->ar_coeff_lag;
        iVar31 = params->num_y_points;
        iVar52 = 1 << ((char)params->ar_coeff_shift - 1U & 0x1f);
        uVar28 = (ulong)uVar64;
        if ((params->num_cb_points == 0) && (params->chroma_scaling_from_luma == 0)) {
          memset(__s_00,0,uVar49);
        }
        else {
          uVar64 = *(uint *)&params->random_seed ^ 0xb524;
          uVar48 = 0;
          piVar51 = __s_00;
          do {
            uVar53 = 0;
            do {
              uVar64 = uVar64 & 0xffff;
              uVar64 = (uVar64 ^ uVar64 >> 1 ^ uVar64 >> 0xc ^ uVar64 >> 3) << 0xf | uVar64 >> 1;
              piVar51[uVar53] =
                   *(int *)((long)gaussian_sequence + (ulong)(uVar64 >> 3 & 0x1ffc)) +
                   ((1 << (bVar24 & 0x1f)) >> 1) >> (bVar24 & 0x1f);
              uVar53 = uVar53 + 1;
            } while (uVar59 != uVar53);
            uVar48 = uVar48 + 1;
            piVar51 = (int *)((long)piVar51 + (ulong)(right_stride * 4));
          } while (uVar48 != uVar28);
          random_register = (uint16_t)uVar64;
        }
        uVar48 = (ulong)(uint)(iVar67 + iVar35);
        uVar64 = (uint)(0 < iVar31) + (iVar13 + 1) * iVar13 * 2;
        if ((params->num_cr_points == 0) && (params->chroma_scaling_from_luma == 0)) {
          memset(__s_01,0,uVar49);
        }
        else {
          uVar44 = *(uint *)&params->random_seed ^ 0x49d8;
          uVar49 = 0;
          piVar51 = __s_01;
          do {
            uVar53 = 0;
            do {
              uVar44 = uVar44 & 0xffff;
              uVar44 = (uVar44 ^ uVar44 >> 1 ^ uVar44 >> 0xc ^ uVar44 >> 3) << 0xf | uVar44 >> 1;
              piVar51[uVar53] =
                   *(int *)((long)gaussian_sequence + (ulong)(uVar44 >> 3 & 0x1ffc)) +
                   ((1 << (bVar24 & 0x1f)) >> 1) >> (bVar24 & 0x1f);
              uVar53 = uVar53 + 1;
            } while (uVar59 != uVar53);
            uVar49 = uVar49 + 1;
            piVar51 = (int *)((long)piVar51 + (ulong)(right_stride * 4));
          } while (uVar49 != uVar28);
          random_register = (uint16_t)uVar44;
        }
        uVar49 = 3;
        bVar74 = false;
        do {
          iVar67 = grain_max;
          iVar13 = grain_min;
          iVar31 = (int)uVar49 + -3 << bVar22;
          lVar41 = uVar49 * uVar59;
          lVar55 = (long)(iVar31 + 3);
          bVar73 = true;
          uVar53 = 3;
          do {
            if ((int)uVar64 < 1) {
              iVar54 = 0;
              iVar50 = 0;
              bVar30 = 0 < (int)uVar64;
            }
            else {
              iVar14 = (int)uVar53 + -3 << bVar23;
              lVar60 = (long)(iVar14 + 3) + -1;
              uVar70 = 0;
              iVar50 = 0;
              iVar54 = 0;
              do {
                piVar51 = ppiVar17[uVar70];
                if (piVar51[2] == 0) {
                  iVar37 = piVar51[1] + (int)uVar53 + (*piVar51 + (int)uVar49) * right_stride;
                  iVar26 = __s_00[iVar37] * params->ar_coeffs_cb[uVar70];
                  iVar71 = params->ar_coeffs_cr[uVar70];
                  piVar51 = __s_01 + iVar37;
                }
                else {
                  if (piVar51[2] != 1) {
                    av1_add_film_grain_cold_1();
                    goto LAB_00188cf2;
                  }
                  iVar71 = 0;
                  lVar20 = lVar60;
                  lVar43 = lVar55;
                  piVar51 = __s + lVar55 * 0x52;
                  do {
                    do {
                      iVar71 = iVar71 + piVar51[lVar20 + 1];
                      lVar20 = lVar20 + 1;
                    } while (lVar20 < local_338 + iVar14 + 3);
                    piVar51 = piVar51 + 0x52;
                    bVar30 = lVar43 < local_330 + iVar31 + 3;
                    lVar20 = lVar60;
                    lVar43 = lVar43 + 1;
                  } while (bVar30);
                  iVar71 = (int)(iVar71 + ((uint)(1 << bVar22 + bVar23) >> 1)) >> bVar22 + bVar23;
                  iVar26 = params->ar_coeffs_cb[uVar70] * iVar71;
                  piVar51 = params->ar_coeffs_cr + uVar70;
                }
                iVar54 = iVar54 + iVar26;
                iVar50 = iVar50 + iVar71 * *piVar51;
                uVar70 = uVar70 + 1;
              } while (uVar70 != uVar64);
              bVar30 = false;
            }
            if ((params->num_cb_points != 0) || (params->chroma_scaling_from_luma != 0)) {
              iVar14 = (iVar54 + iVar52 >> ((byte)params->ar_coeff_shift & 0x1f)) +
                       __s_00[lVar41 + uVar53];
              iVar54 = iVar67;
              if (iVar14 < iVar67) {
                iVar54 = iVar14;
              }
              if (iVar14 < iVar13) {
                iVar54 = iVar13;
              }
              __s_00[lVar41 + uVar53] = iVar54;
            }
            if ((params->num_cr_points != 0) || (params->chroma_scaling_from_luma != 0)) {
              iVar54 = (iVar50 + iVar52 >> ((byte)params->ar_coeff_shift & 0x1f)) +
                       __s_01[lVar41 + uVar53];
              iVar50 = iVar67;
              if (iVar54 < iVar67) {
                iVar50 = iVar54;
              }
              if (iVar54 < iVar13) {
                iVar50 = iVar13;
              }
              __s_01[lVar41 + uVar53] = iVar50;
            }
            if (bVar30) {
LAB_00188cf2:
              if (bVar73) goto LAB_00188d14;
              break;
            }
            uVar53 = uVar53 + 1;
            bVar73 = uVar53 < uVar48;
          } while (uVar53 != uVar48);
          uVar49 = uVar49 + 1;
          bVar74 = uVar28 <= uVar49;
        } while (uVar49 != uVar28);
LAB_00188d14:
        if (!bVar74) {
          return -1;
        }
        init_scaling_function(params->scaling_points_y,params->num_y_points,scaling_lut_y);
        if (params->chroma_scaling_from_luma == 0) {
          init_scaling_function(params->scaling_points_cb,params->num_cb_points,scaling_lut_cb);
          init_scaling_function(params->scaling_points_cr,params->num_cr_points,scaling_lut_cr);
        }
        else {
          memcpy(scaling_lut_cb,scaling_lut_y,0x400);
          memcpy(scaling_lut_cr,scaling_lut_y,0x400);
        }
        iVar13 = 0;
        if (1 < (int)uVar34) {
          iVar52 = iVar38 / 2;
          bVar24 = bVar22 ^ 1;
          bVar25 = bVar23 ^ 1;
          iVar67 = 2 - local_338;
          local_48 = (long)iVar52;
          local_68 = (ulong)uVar34;
          iVar31 = uVar33 * 2 + 6 + uVar39 * 6;
          local_70 = __s + 0xd2b;
          uVar49 = (ulong)((uVar33 * 2 + uVar39 * 6) * 4 + 0x18);
          uVar59 = 0;
          uVar33 = uVar34;
          local_b0 = (ulong)uVar39;
          do {
            local_58 = (long)(int)uVar33;
            if (0x21 < local_58) {
              local_58 = 0x22;
            }
            sVar4 = (short)(uVar59 >> 4);
            random_register =
                 (sVar4 * 0xad + 0x69U & 0xff) + sVar4 * 0x2500 + 0xb200 ^ params->random_seed;
            if (1 < iVar38) {
              local_60 = uVar59 * 2;
              uVar64 = uVar34 - (int)local_60;
              local_78 = 0x22;
              if ((int)uVar64 < 0x22) {
                local_78 = (ulong)uVar64;
              }
              iVar50 = (int)uVar64 >> bVar22;
              bVar74 = uVar59 != 0;
              iVar13 = 0;
              if (bVar74) {
                iVar13 = 2 - local_330;
              }
              uVar44 = (uint)uVar59;
              uVar64 = bVar74 | uVar44;
              lVar41 = (long)(int)(uVar64 * iVar11 * 2);
              local_c0 = local_128 + lVar41 * 2;
              lVar55 = (long)(int)((uVar64 << bVar24) * iVar12);
              local_d0 = local_118 + lVar55 * 2;
              uVar28 = (ulong)(uint)(iVar13 * iVar67 * 4);
              piVar51 = (int *)((long)left_block_00 + uVar28);
              cr_grain_00 = (int *)(uVar28 + (long)left_block_01);
              iVar13 = (uVar34 >> 1) - uVar44;
              if (0xf < iVar13) {
                iVar13 = 0x10;
              }
              local_d8 = local_120 + lVar55 * 2;
              iVar54 = iVar13 - (uint)bVar74;
              local_b8 = local_128 + lVar41;
              bVar73 = bVar74 && iVar68 != 0;
              local_e0 = local_118 + lVar55;
              local_c8 = local_120 + lVar55;
              lVar41 = (long)(int)((uVar44 << bVar24) * iVar12);
              local_f8 = local_128 + local_60 * lVar27 * 2;
              local_e8 = local_128 + local_60 * lVar27;
              local_100 = local_118 + lVar41 * 2;
              local_108 = local_120 + lVar41 * 2;
              local_110 = local_118 + lVar41;
              local_f0 = local_120 + lVar41;
              uVar64 = (uint)bVar73;
              lVar55 = (long)(int)((uVar64 | uVar44) * iVar11 * 2);
              lVar41 = (long)(int)(((uVar64 | uVar44) << bVar24) * iVar12);
              iVar13 = iVar13 - (uint)bVar73;
              local_40 = (ulong)(bVar73 + uVar64);
              local_38 = (ulong)(uVar64 << bVar24);
              local_90 = local_128 + lVar55 * 2;
              local_80 = local_128 + lVar55;
              local_98 = local_118 + lVar41 * 2;
              local_a0 = local_120 + lVar41 * 2;
              local_a8 = local_118 + lVar41;
              local_88 = local_120 + lVar41;
              lVar41 = 0;
              local_208 = piVar16;
              do {
                uVar5 = random_register >> 1;
                iVar14 = (uint)(ushort)(random_register ^ uVar5 ^
                                       random_register >> 0xc ^ random_register >> 3) * 0x8000;
                uVar64 = iVar14 + (uint)uVar5;
                uVar56 = (uint16_t)uVar64;
                uVar64 = uVar64 >> 0xc & 0xf;
                uVar44 = random_register >> 9 & 0xf;
                iVar37 = uVar44 * 2 + 9;
                uVar28 = (ulong)(uVar64 * 2 + 9);
                iVar71 = uVar44 * height + height * 3 + 3;
                iVar26 = uVar64 * uVar39 + iVar35;
                bVar30 = lVar41 != 0 && iVar68 != 0;
                uVar64 = (uint)lVar41;
                uVar36 = (uint)(aVar2 == AOM_CICP_MC_IDENTITY);
                random_register = uVar56;
                if (lVar41 != 0 && iVar68 != 0) {
                  ver_boundary_overlap
                            (left_block,2,
                             (int *)((long)__s + uVar28 * 4 + (ulong)(uint)(iVar37 * 0x148)),0x52,
                             left_block,2,2,(int)local_78);
                  uVar48 = (ulong)(iVar71 * right_stride * 4);
                  iVar57 = chroma_subblock_size_y + height;
                  if (iVar50 <= (int)(chroma_subblock_size_y + height)) {
                    iVar57 = iVar50;
                  }
                  ver_boundary_overlap
                            (left_block_00,uVar39,
                             (int *)((long)__s_00 + (uint)(iVar26 * 4) + uVar48),right_stride,
                             left_block_00,uVar39,uVar39,iVar57);
                  iVar57 = chroma_subblock_size_y + height;
                  if (iVar50 <= (int)(chroma_subblock_size_y + height)) {
                    iVar57 = iVar50;
                  }
                  ver_boundary_overlap
                            (left_block_01,uVar39,
                             (int *)((long)__s_01 + (uint)(iVar26 * 4) + uVar48),right_stride,
                             left_block_01,uVar39,uVar39,iVar57);
                  lVar55 = (long)(int)(uVar64 << bVar25);
                  if (bVar8) {
                    add_noise_to_block(params,local_b8 + lVar41 * 2,local_e0 + lVar55,
                                       local_c8 + lVar55,iVar11,iVar12,
                                       left_block + (ulong)bVar74 * 4,piVar51,cr_grain_00,2,iVar67,
                                       iVar54,1,uVar3,local_330,local_338,uVar36);
                  }
                  else {
                    add_noise_to_block_hbd
                              (params,(uint16_t *)(local_c0 + lVar41 * 4),
                               (uint16_t *)(local_d0 + lVar55 * 2),
                               (uint16_t *)(local_d8 + lVar55 * 2),iVar11,iVar12,
                               left_block + (ulong)bVar74 * 4,piVar51,cr_grain_00,2,iVar67,iVar54,1,
                               uVar3,local_330,local_338,uVar36);
                  }
                }
                if (bVar73) {
                  piVar63 = piVar16 + lVar41 * 2;
                  if (lVar41 == 0) {
                    iVar57 = 0x20;
                    lVar55 = 0;
                  }
                  else {
                    hor_boundary_overlap(piVar63,iVar11,left_block,2,piVar63,iVar11,2,2);
                    lVar55 = lVar41 * local_b0;
                    hor_boundary_overlap
                              (piVar18 + lVar55,iVar12,left_block_00,uVar39,piVar18 + lVar55,iVar12,
                               uVar39,height);
                    hor_boundary_overlap
                              (piVar19 + lVar55,iVar12,left_block_01,uVar39,piVar19 + lVar55,iVar12,
                               uVar39,height);
                    lVar55 = 2;
                    iVar57 = 0x1e;
                  }
                  uVar45 = uVar64 | 1;
                  if (lVar41 == 0) {
                    uVar45 = 0;
                  }
                  iVar72 = iVar38 + uVar45 * -2;
                  if (iVar72 <= iVar57) {
                    iVar57 = iVar72;
                  }
                  hor_boundary_overlap
                            (piVar16 + (int)(uVar45 * 2),iVar11,
                             (int *)((long)__s +
                                    lVar55 * 4 + uVar28 * 4 + (ulong)(uint)(iVar37 * 0x148)),0x52,
                             piVar16 + (int)(uVar45 * 2),iVar11,iVar57,2);
                  uVar48 = (ulong)(iVar71 * right_stride * 4);
                  uVar65 = (uint)(lVar41 != 0) << bVar25;
                  local_50 = (ulong)(uint)(iVar26 * 4);
                  iVar72 = iVar72 >> bVar23;
                  iVar57 = chroma_subblock_size_x - uVar65;
                  if (iVar72 <= (int)(chroma_subblock_size_x - uVar65)) {
                    iVar57 = iVar72;
                  }
                  hor_boundary_overlap
                            (piVar18 + (int)(uVar45 << bVar25),iVar12,
                             (int *)((long)__s_00 + (ulong)uVar65 * 4 + local_50 + uVar48),
                             right_stride,piVar18 + (int)(uVar45 << bVar25),iVar12,iVar57,height);
                  iVar57 = chroma_subblock_size_x - uVar65;
                  if (iVar72 <= (int)(chroma_subblock_size_x - uVar65)) {
                    iVar57 = iVar72;
                  }
                  hor_boundary_overlap
                            (piVar19 + (int)(uVar45 << bVar25),iVar12,
                             (int *)((long)__s_01 + (ulong)uVar65 * 4 + local_50 + uVar48),
                             right_stride,piVar19 + (int)(uVar45 << bVar25),iVar12,iVar57,height);
                  lVar55 = (long)(int)(uVar64 << bVar25);
                  iVar57 = iVar52 - uVar64;
                  if (0xf < (int)(iVar52 - uVar64)) {
                    iVar57 = 0x10;
                  }
                  if (bVar8) {
                    add_noise_to_block(params,local_e8 + lVar41 * 2,local_110 + lVar55,
                                       local_f0 + lVar55,iVar11,iVar12,piVar63,piVar18 + lVar55,
                                       piVar19 + lVar55,iVar11,iVar12,1,iVar57,uVar3,local_330,
                                       local_338,uVar36);
                  }
                  else {
                    add_noise_to_block_hbd
                              (params,(uint16_t *)(local_f8 + lVar41 * 4),
                               (uint16_t *)(local_100 + lVar55 * 2),
                               (uint16_t *)(local_108 + lVar55 * 2),iVar11,iVar12,piVar63,
                               piVar18 + lVar55,piVar19 + lVar55,iVar11,iVar12,1,iVar57,uVar3,
                               local_330,local_338,uVar36);
                  }
                }
                uVar45 = bVar30 | uVar64;
                uVar48 = (ulong)(((int)local_38 + iVar71) * right_stride * 4);
                uVar53 = (ulong)((uint)bVar30 << bVar25);
                piVar63 = (int *)((long)__s +
                                 (ulong)bVar30 * 8 +
                                 uVar28 * 4 + (ulong)(uint)(((int)local_40 + iVar37) * 0x148));
                piVar61 = (int *)((long)__s_00 + uVar53 * 4 + (uint)(iVar26 * 4) + uVar48);
                cr_grain = (int *)((long)__s_01 + uVar53 * 4 + (uint)(iVar26 * 4) + uVar48);
                iVar26 = iVar52 - uVar64;
                if (0xf < iVar26) {
                  iVar26 = 0x10;
                }
                lVar60 = (long)(int)(uVar45 * 2);
                lVar55 = (long)(int)(uVar45 << bVar25);
                if (bVar8) {
                  add_noise_to_block(params,local_80 + lVar60,local_a8 + lVar55,local_88 + lVar55,
                                     iVar11,iVar12,piVar63,piVar61,cr_grain,0x52,right_stride,iVar13
                                     ,iVar26 - (uint)bVar30,uVar3,local_330,local_338,uVar36);
                }
                else {
                  add_noise_to_block_hbd
                            (params,(uint16_t *)(local_90 + lVar60 * 2),
                             (uint16_t *)(local_98 + lVar55 * 2),(uint16_t *)(local_a0 + lVar55 * 2)
                             ,iVar11,iVar12,piVar63,piVar61,cr_grain,0x52,right_stride,iVar13,
                             iVar26 - (uint)bVar30,uVar3,local_330,local_338,uVar36);
                }
                if (iVar68 != 0) {
                  if (lVar41 == 0) {
                    uVar36 = 0;
                  }
                  else {
                    lVar55 = 0;
                    piVar63 = local_208;
                    do {
                      *(undefined8 *)piVar63 = *(undefined8 *)(left_block + lVar55 * 2 + 0x40);
                      lVar55 = lVar55 + 1;
                      piVar63 = piVar63 + lVar27;
                    } while ((int)lVar55 != 2);
                    uVar36 = chroma_subblock_size_y << bVar25;
                    piVar63 = piVar18 + (int)(uVar64 << bVar25);
                    piVar61 = left_block_00 + uVar36;
                    uVar48 = uVar46;
                    do {
                      memcpy(piVar63,piVar61,__n);
                      piVar61 = (int *)((long)piVar61 + __n);
                      piVar63 = piVar63 + lVar47;
                      uVar45 = (int)uVar48 - 1;
                      uVar48 = (ulong)uVar45;
                    } while (uVar45 != 0);
                    piVar63 = piVar19 + (int)(uVar64 << bVar25);
                    piVar61 = left_block_01 + uVar36;
                    uVar48 = uVar46;
                    do {
                      memcpy(piVar63,piVar61,__n);
                      piVar61 = (int *)((long)piVar61 + __n);
                      piVar63 = piVar63 + lVar47;
                      uVar36 = (int)uVar48 - 1;
                      uVar48 = (ulong)uVar36;
                    } while (uVar36 != 0);
                    uVar36 = 2;
                  }
                  piVar63 = local_70;
                  uVar45 = uVar64 | 1;
                  if (lVar41 == 0) {
                    uVar45 = 0;
                  }
                  piVar61 = piVar16 + (int)(uVar45 * 2);
                  iVar57 = iVar38 + uVar64 * -2;
                  iVar26 = 0x20;
                  if (iVar57 < 0x20) {
                    iVar26 = iVar57;
                  }
                  uVar64 = (uint)uVar5 + iVar14;
                  lVar55 = 0;
                  do {
                    memcpy(piVar61,(void *)((long)piVar63 +
                                           lVar55 + (ulong)(uVar64 >> 9 & 0x78) +
                                                    (ulong)uVar44 * 0x290 + (ulong)uVar36 * 4),
                           (long)(int)(iVar26 - uVar36) << 2);
                    iVar14 = chroma_subblock_size_y;
                    lVar55 = lVar55 + 0x148;
                    piVar61 = piVar61 + lVar27;
                  } while ((int)lVar55 != 0x290);
                  uVar44 = 0;
                  if (lVar41 != 0) {
                    uVar44 = uVar39;
                  }
                  uVar48 = (ulong)(uint)chroma_subblock_size_x;
                  iVar26 = iVar57 >> bVar23;
                  if (chroma_subblock_size_x < iVar57 >> bVar23) {
                    iVar26 = chroma_subblock_size_x;
                  }
                  piVar63 = piVar18 + (int)(uVar45 << bVar25);
                  sVar32 = (long)(int)(iVar26 - uVar44) << 2;
                  uVar70 = (ulong)(uint)((iVar71 + chroma_subblock_size_y) * iVar31);
                  uVar29 = (ulong)(((uVar64 >> 0xc & 0xf) + 3) * uVar39);
                  pvVar62 = (void *)((long)__s_00 +
                                    (ulong)(uVar44 << 2) + uVar70 * 4 + uVar29 * 4 + 0xc);
                  uVar53 = uVar46;
                  do {
                    memcpy(piVar63,pvVar62,sVar32);
                    pvVar62 = (void *)((long)pvVar62 + uVar49);
                    piVar63 = piVar63 + lVar47;
                    uVar64 = (int)uVar53 - 1;
                    uVar53 = (ulong)uVar64;
                  } while (uVar64 != 0);
                  piVar63 = piVar19 + (int)(uVar45 << bVar25);
                  pvVar62 = (void *)((long)__s_01 +
                                    (ulong)(uVar44 << 2) + uVar70 * 4 + uVar29 * 4 + 0xc);
                  uVar53 = uVar46;
                  do {
                    memcpy(piVar63,pvVar62,sVar32);
                    pvVar62 = (void *)((long)pvVar62 + uVar49);
                    piVar63 = piVar63 + lVar47;
                    uVar64 = (int)uVar53 - 1;
                    uVar53 = (ulong)uVar64;
                  } while (uVar64 != 0);
                  if (local_60 != local_68) {
                    puVar21 = (undefined8 *)
                              ((long)__s + uVar28 * 4 + (ulong)(uint)(iVar37 * 0x148) + 0x80);
                    lVar55 = 0;
                    do {
                      *(undefined8 *)(left_block + lVar55 * 2) = *puVar21;
                      puVar21 = puVar21 + 0x29;
                      lVar55 = lVar55 + 1;
                    } while ((int)local_58 != (int)lVar55);
                  }
                  iVar37 = iVar14 + height;
                  if (iVar50 <= (int)(iVar14 + height)) {
                    iVar37 = iVar50;
                  }
                  if (iVar37 != 0) {
                    uVar28 = (ulong)(uint)(iVar71 * iVar31);
                    piVar61 = __s_00 + uVar29 + uVar48 + uVar28 + 3;
                    piVar63 = left_block_00;
                    iVar14 = iVar37;
                    do {
                      memcpy(piVar63,piVar61,__n);
                      piVar61 = (int *)((long)piVar61 + uVar49);
                      piVar63 = (int *)((long)piVar63 + __n);
                      iVar14 = iVar14 + -1;
                    } while (iVar14 != 0);
                    if (iVar37 != 0) {
                      piVar61 = __s_01 + uVar29 + uVar28 + uVar48 + 3;
                      piVar63 = left_block_01;
                      do {
                        memcpy(piVar63,piVar61,__n);
                        piVar61 = (int *)((long)piVar61 + uVar49);
                        piVar63 = (int *)((long)piVar63 + __n);
                        iVar37 = iVar37 + -1;
                      } while (iVar37 != 0);
                    }
                  }
                }
                lVar41 = lVar41 + 0x10;
                local_208 = local_208 + 0x20;
              } while (lVar41 < local_48);
            }
            uVar59 = uVar59 + 0x10;
            uVar33 = uVar33 - 0x20;
            iVar13 = 0;
          } while (uVar59 < uVar34 >> 1);
        }
      }
      goto LAB_00188610;
    }
  }
LAB_0018860a:
  iVar13 = -1;
LAB_00188610:
  dealloc_arrays(params,&pred_pos_luma,&pred_pos_chroma,&luma_grain_block,&cb_grain_block,
                 &cr_grain_block,&y_line_buf,&cb_line_buf,&cr_line_buf,&y_col_buf,&cb_col_buf,
                 &local_180);
  return iVar13;
}

Assistant:

int av1_add_film_grain(const aom_film_grain_t *params, const aom_image_t *src,
                       aom_image_t *dst) {
  uint8_t *luma, *cb, *cr;
  int height, width, luma_stride, chroma_stride;
  int use_high_bit_depth = 0;
  int chroma_subsamp_x = 0;
  int chroma_subsamp_y = 0;
  int mc_identity = src->mc == AOM_CICP_MC_IDENTITY ? 1 : 0;

  switch (src->fmt) {
    case AOM_IMG_FMT_AOMI420:
    case AOM_IMG_FMT_I420:
      use_high_bit_depth = 0;
      chroma_subsamp_x = 1;
      chroma_subsamp_y = 1;
      break;
    case AOM_IMG_FMT_I42016:
      use_high_bit_depth = 1;
      chroma_subsamp_x = 1;
      chroma_subsamp_y = 1;
      break;
      //    case AOM_IMG_FMT_444A:
    case AOM_IMG_FMT_I444:
      use_high_bit_depth = 0;
      chroma_subsamp_x = 0;
      chroma_subsamp_y = 0;
      break;
    case AOM_IMG_FMT_I44416:
      use_high_bit_depth = 1;
      chroma_subsamp_x = 0;
      chroma_subsamp_y = 0;
      break;
    case AOM_IMG_FMT_I422:
      use_high_bit_depth = 0;
      chroma_subsamp_x = 1;
      chroma_subsamp_y = 0;
      break;
    case AOM_IMG_FMT_I42216:
      use_high_bit_depth = 1;
      chroma_subsamp_x = 1;
      chroma_subsamp_y = 0;
      break;
    default:  // unknown input format
      fprintf(stderr, "Film grain error: input format is not supported!");
      return -1;
  }

  assert(params->bit_depth == src->bit_depth);

  dst->fmt = src->fmt;
  dst->bit_depth = src->bit_depth;

  dst->r_w = src->r_w;
  dst->r_h = src->r_h;
  dst->d_w = src->d_w;
  dst->d_h = src->d_h;

  dst->cp = src->cp;
  dst->tc = src->tc;
  dst->mc = src->mc;

  dst->monochrome = src->monochrome;
  dst->csp = src->csp;
  dst->range = src->range;

  dst->x_chroma_shift = src->x_chroma_shift;
  dst->y_chroma_shift = src->y_chroma_shift;

  dst->temporal_id = src->temporal_id;
  dst->spatial_id = src->spatial_id;

  width = src->d_w % 2 ? src->d_w + 1 : src->d_w;
  height = src->d_h % 2 ? src->d_h + 1 : src->d_h;

  copy_rect(src->planes[AOM_PLANE_Y], src->stride[AOM_PLANE_Y],
            dst->planes[AOM_PLANE_Y], dst->stride[AOM_PLANE_Y], src->d_w,
            src->d_h, use_high_bit_depth);
  // Note that dst is already assumed to be aligned to even.
  extend_even(dst->planes[AOM_PLANE_Y], dst->stride[AOM_PLANE_Y], src->d_w,
              src->d_h, use_high_bit_depth);

  if (!src->monochrome) {
    copy_rect(src->planes[AOM_PLANE_U], src->stride[AOM_PLANE_U],
              dst->planes[AOM_PLANE_U], dst->stride[AOM_PLANE_U],
              width >> chroma_subsamp_x, height >> chroma_subsamp_y,
              use_high_bit_depth);

    copy_rect(src->planes[AOM_PLANE_V], src->stride[AOM_PLANE_V],
              dst->planes[AOM_PLANE_V], dst->stride[AOM_PLANE_V],
              width >> chroma_subsamp_x, height >> chroma_subsamp_y,
              use_high_bit_depth);
  }

  luma = dst->planes[AOM_PLANE_Y];
  cb = dst->planes[AOM_PLANE_U];
  cr = dst->planes[AOM_PLANE_V];

  // luma and chroma strides in samples
  luma_stride = dst->stride[AOM_PLANE_Y] >> use_high_bit_depth;
  chroma_stride = dst->stride[AOM_PLANE_U] >> use_high_bit_depth;

  return add_film_grain_run(params, luma, cb, cr, height, width, luma_stride,
                            chroma_stride, use_high_bit_depth, chroma_subsamp_y,
                            chroma_subsamp_x, mc_identity);
}